

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>,3,2>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
                 *xpr)

{
  bool bVar1;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
  *this;
  Index IVar2;
  result_type rVar3;
  double adVar4 [2];
  double local_38 [3];
  Scalar res;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
  *xpr_local;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
  *eval_local;
  
  res = (Scalar)xpr;
  xpr_local = (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
               *)func;
  func_local = (scalar_sum_op<double,_double> *)eval;
  IVar2 = CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
          ::rows(xpr);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
            ::cols((CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
                    *)res);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  this = xpr_local;
  if (!bVar1) {
    __assert_fail("xpr.rows()>0 && xpr.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x156,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Matrix<double, 3, 1>, 2, 1>>>>::run(const Evaluator &, const Func &, const XprType &) [Func = Eigen::internal::scalar_sum_op<double>, Evaluator = Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Matrix<double, 3, 1>, 2, 1>>>, Traversal = 3, Unrolling = 2, XprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Matrix<double, 3, 1>, 2, 1>>]"
                 );
  }
  adVar4 = redux_vec_unroller<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>,0,1>
           ::run<double__vector(2)>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                       *)func_local,(scalar_sum_op<double,_double> *)xpr_local);
  local_38[0] = adVar4[0];
  rVar3 = scalar_sum_op<double,double>::predux<double__vector(2)>
                    ((scalar_sum_op<double,double> *)this,(double (*) [2])local_38);
  return rVar3;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE
  Scalar run(const Evaluator &eval, const Func& func, const XprType &xpr)
  {
    EIGEN_ONLY_USED_FOR_DEBUG(xpr)
    eigen_assert(xpr.rows()>0 && xpr.cols()>0 && "you are using an empty matrix");
    if (VectorizedSize > 0) {
      Scalar res = func.predux(redux_vec_unroller<Func, Evaluator, 0, Size / PacketSize>::template run<PacketType>(eval,func));
      if (VectorizedSize != Size)
        res = func(res,redux_novec_unroller<Func, Evaluator, VectorizedSize, Size-VectorizedSize>::run(eval,func));
      return res;
    }
    else {
      return redux_novec_unroller<Func, Evaluator, 0, Size>::run(eval,func);
    }
  }